

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O3

void __thiscall
lf::geometry::SegmentO2::SegmentO2(SegmentO2 *this,Matrix<double,__1,_3,_0,__1,_3> *coords)

{
  Matrix<double,__1,_3,_0,__1,_3> *pMVar1;
  double *pdVar2;
  double *pdVar3;
  Index IVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  scalar_constant_op<double> sVar9;
  Index index;
  ulong uVar10;
  long lVar11;
  double dVar12;
  ReturnType RVar13;
  ActualDstType actualDst;
  scalar_product_op<double,_double> local_3f9;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_3f8;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_3f0;
  Matrix<double,__1,_1,_0,__1,_1> *local_3e8;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_3e0;
  double local_3c8;
  undefined8 uStack_3c0;
  PointerType local_3b8;
  undefined8 uStack_3b0;
  Rhs local_3a0;
  scalar_constant_op<double> local_368;
  Lhs local_360;
  Rhs local_328;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_2f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_290;
  undefined1 local_218 [32];
  scalar_constant_op<double> local_1f8;
  scalar_constant_op<double> sStack_1f0;
  variable_if_dynamic<long,__1> local_1e8;
  PointerType local_1b8;
  scalar_constant_op<double> local_190;
  PointerType local_188;
  scalar_constant_op<double> local_158;
  PointerType local_150;
  PointerType local_140;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
  local_100;
  
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_0045a8b8;
  pMVar1 = &this->coords_;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data =
       (double *)0x0;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows = 0;
  local_3f0 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->alpha_;
  local_3f8 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->beta_;
  local_3e8 = &this->gamma_;
  this->alpha_squared_ = 0.0;
  this->alpha_beta_ = 0.0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  this->beta_squared_ = 0.0;
  IVar4 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_360,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar4,IVar4,1);
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 1;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_328,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data,
             local_360.
             super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
             m_outerStride,1);
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_290,&local_360,&local_328,(scalar_sum_op<double,_double> *)&local_2f0);
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       (PointerType)0x4000000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_2f0,
                   local_290.m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
                   .m_rows.m_value,1,(scalar_constant_op<double> *)&local_3a0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
                   *)&local_100,(Lhs *)&local_2f0,&local_290,
                  (scalar_product_op<double,_double> *)&local_3e0);
  IVar4 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_3a0,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar4 * 2,IVar4,1);
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 2;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_368.m_other = 4.0;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp(&local_3e0,
                   local_3a0.
                   super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
                   .m_rows.m_value,1,&local_368);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_2f0,&local_3e0,&local_3a0,&local_3f9);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
                   *)local_218,(Lhs *)&local_100,&local_2f0,
                  (scalar_difference_op<double,_double> *)&local_3e0);
  sVar9.m_other = sStack_1f0.m_other;
  local_3b8 = (PointerType)local_1f8.m_other;
  uStack_3b0 = 0;
  local_3c8 = local_158.m_other;
  uStack_3c0 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_3f0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)local_218,(assign_op<double,_double> *)&local_3e0);
  pdVar5 = (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar6 = (this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar10 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar6) {
    lVar11 = 0;
    do {
      pdVar2 = (double *)((long)sVar9.m_other + lVar11 * 8);
      dVar12 = pdVar2[1];
      dVar7 = (local_1b8 + lVar11)[1];
      dVar8 = (local_150 + lVar11)[1];
      pdVar3 = pdVar5 + lVar11;
      *pdVar3 = (local_1b8[lVar11] + *pdVar2) * (double)local_3b8 - local_150[lVar11] * local_3c8;
      pdVar3[1] = (dVar7 + dVar12) * (double)local_3b8 - dVar8 * local_3c8;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar6) {
    do {
      pdVar5[uVar10] =
           (*(double *)((long)sVar9.m_other + uVar10 * 8) + local_1b8[uVar10]) * (double)local_3b8 -
           local_150[uVar10] * local_3c8;
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  IVar4 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_360,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar4 * 2,IVar4,1);
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 2;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
       (PointerType)0x4010000000000000;
  local_360.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_2f0,
                   local_360.
                   super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
                   .m_rows.m_value,1,(scalar_constant_op<double> *)&local_328);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)&local_290,(Lhs *)&local_2f0,&local_360,
                  (scalar_product_op<double,_double> *)&local_3a0);
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_328,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_rows,1);
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_3e0.m_rows.m_value = 0x4008000000000000;
  local_328.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_3a0,
                   local_328.
                   super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
                   .super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
                   .m_rows.m_value,1,(scalar_constant_op<double> *)&local_3e0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_2f0,(Lhs *)&local_3a0,&local_328,
                  (scalar_product_op<double,_double> *)&local_368);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>
  ::CwiseBinaryOp(&local_100,(Lhs *)&local_290,&local_2f0,
                  (scalar_difference_op<double,_double> *)&local_3a0);
  IVar4 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_3a0,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar4,IVar4,1);
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 1;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_3a0.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = pMVar1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_218,&local_100,&local_3a0,
                  (scalar_difference_op<double,_double> *)&local_3e0);
  local_3b8 = (PointerType)sStack_1f0.m_other;
  uStack_3b0 = 0;
  local_3c8 = local_190.m_other;
  uStack_3c0 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>const>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_3f8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
              *)local_218,(assign_op<double,_double> *)&local_3e0);
  pdVar5 = (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar6 = (this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar10 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar6) {
    lVar11 = 0;
    do {
      pdVar2 = (double *)(local_1e8.m_value + lVar11 * 8);
      dVar12 = pdVar2[1];
      dVar7 = (local_188 + lVar11)[1];
      dVar8 = (local_140 + lVar11)[1];
      pdVar3 = pdVar5 + lVar11;
      *pdVar3 = (*pdVar2 * (double)local_3b8 - local_188[lVar11] * local_3c8) - local_140[lVar11];
      pdVar3[1] = (dVar12 * (double)local_3b8 - dVar7 * local_3c8) - dVar8;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar6) {
    do {
      pdVar5[uVar10] =
           (*(double *)(local_1e8.m_value + uVar10 * 8) * (double)local_3b8 -
           local_188[uVar10] * local_3c8) - local_140[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             local_218,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_rows,1);
  local_1f8.m_other = 0.0;
  sStack_1f0.m_other = 0.0;
  local_1e8.m_value =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_218._24_8_ = pMVar1;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>,double,double>
            (local_3e8,(Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *)local_218,
             (assign_op<double,_double> *)&local_100);
  pdVar5 = (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar6 = (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar10 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar6) {
    lVar11 = 0;
    do {
      dVar12 = ((double *)(local_218._0_8_ + lVar11 * 8))[1];
      pdVar2 = pdVar5 + lVar11;
      *pdVar2 = *(double *)(local_218._0_8_ + lVar11 * 8);
      pdVar2[1] = dVar12;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar6) {
    do {
      pdVar5[uVar10] = *(double *)(local_218._0_8_ + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  local_218._0_8_ = local_3f0;
  if ((this->alpha_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    dVar12 = 0.0;
  }
  else {
    dVar12 = Eigen::
             DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
             ::redux<Eigen::internal::scalar_sum_op<double,double>>
                       ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_218,(scalar_sum_op<double,_double> *)&local_100);
  }
  this->alpha_squared_ = dVar12;
  RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
           dot<Eigen::Matrix<double,_1,1,0,_1,1>>(local_3f0,local_3f8);
  this->alpha_beta_ = RVar13;
  local_218._0_8_ = local_3f8;
  if ((this->beta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    dVar12 = 0.0;
  }
  else {
    dVar12 = Eigen::
             DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
             ::redux<Eigen::internal::scalar_sum_op<double,double>>
                       ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_218,(scalar_sum_op<double,_double> *)&local_100);
  }
  this->beta_squared_ = dVar12;
  return;
}

Assistant:

SegmentO2::SegmentO2(Eigen::Matrix<double, Eigen::Dynamic, 3> coords)
    : coords_(std::move(coords)) {
  // polynomial of degree 2: alpha * x^2 + beta * x + gamma
  alpha_ = 2. * (coords_.col(1) + coords_.col(0)) - 4. * coords_.col(2);
  beta_ = 4. * coords_.col(2) - 3. * coords_.col(0) - coords_.col(1);
  gamma_ = coords_.col(0);

  // coefficients for JacobianInverseGramian and IntegrationElement
  alpha_squared_ = alpha_.squaredNorm();
  alpha_beta_ = alpha_.dot(beta_);
  beta_squared_ = beta_.squaredNorm();
}